

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_dup_r(lyd_node *node,ly_ctx *trg_ctx,lyd_node *parent,uint32_t insert_order,
                lyd_node **first,uint32_t options,lyd_node **dup_p)

{
  lysc_node **trg_schema;
  ly_ctx **pplVar1;
  ushort uVar2;
  uint uVar3;
  LY_VALUE_FORMAT LVar4;
  lyd_attr *plVar5;
  ly_ctx *ctx;
  lysc_node *type;
  uint uVar6;
  LY_ERR LVar7;
  lyd_node_opaq *parent_00;
  lyd_attr *attr;
  lys_module *plVar8;
  lyd_attr *plVar9;
  lyd_node *plVar10;
  ly_ht *plVar11;
  size_t sVar12;
  char *pcVar13;
  lysc_node *plVar14;
  lyd_meta *meta;
  long lVar15;
  
  uVar3 = node->flags;
  if ((uVar3 & 8) == 0) {
    plVar14 = node->schema;
  }
  else {
    if ((options & 0x10) != 0) {
      return LY_SUCCESS;
    }
    plVar14 = node->schema;
    if (plVar14 == (lysc_node *)0x0) {
      plVar8 = (lys_module *)&node[2].schema;
    }
    else {
      plVar8 = plVar14->module;
    }
    trg_ctx = plVar8->ctx;
  }
  if (plVar14 == (lysc_node *)0x0) {
    parent_00 = (lyd_node_opaq *)calloc(1,0x80);
    parent_00->ctx = trg_ctx;
  }
  else {
    uVar2 = plVar14->nodetype;
    if (0x1f < uVar2) {
      if (uVar2 < 0x100) {
        if ((uVar2 == 0x20) || (uVar2 == 0x60)) goto LAB_00125af5;
      }
      else if ((uVar2 == 0x100) || ((uVar2 == 0x400 || (uVar2 == 0x200)))) goto LAB_00125af5;
LAB_00125f0e:
      parent_00 = (lyd_node_opaq *)0x0;
      LVar7 = LY_EINT;
      ly_log(trg_ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c",
             0x810);
      goto LAB_00125f98;
    }
    if (uVar2 < 8) {
      if (uVar2 == 1) goto LAB_00125af5;
      if (uVar2 != 4) goto LAB_00125f0e;
LAB_00125b01:
      sVar12 = 0x60;
    }
    else {
      if (uVar2 == 8) goto LAB_00125b01;
      if (uVar2 != 0x10) goto LAB_00125f0e;
LAB_00125af5:
      sVar12 = 0x48;
    }
    parent_00 = (lyd_node_opaq *)calloc(1,sVar12);
    if (parent_00 == (lyd_node_opaq *)0x0) {
      pcVar13 = "lyd_dup_r";
      parent_00 = (lyd_node_opaq *)0x0;
LAB_00125bdd:
      LVar7 = LY_EMEM;
      ly_log(trg_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar13);
      goto LAB_00125f98;
    }
  }
  uVar6 = uVar3 & 9 | 4;
  if ((options & 8) != 0) {
    uVar6 = uVar3;
  }
  (parent_00->field_0).node.flags = uVar6;
  if ((options & 0x20) != 0) {
    (parent_00->field_0).node.priv = node->priv;
  }
  if (plVar14 == (lysc_node *)0x0) {
    plVar8 = (lys_module *)&node[2].schema;
  }
  else {
    plVar8 = plVar14->module;
  }
  trg_schema = &(parent_00->field_0).node.schema;
  if (trg_ctx == plVar8->ctx) {
    *trg_schema = plVar14;
  }
  else {
    LVar7 = lyd_find_schema_ctx(plVar14,trg_ctx,parent,'\x01',trg_schema);
    if (LVar7 != LY_SUCCESS) {
      free(parent_00);
      parent_00 = (lyd_node_opaq *)0x0;
      goto LAB_00125f98;
    }
  }
  (parent_00->field_0).node.prev = (lyd_node *)parent_00;
  if ((options & 2) == 0) {
    if (node->schema == (lysc_node *)0x0) {
      lVar15._0_4_ = node[2].hash;
      lVar15._4_4_ = node[2].flags;
      if (lVar15 != 0) {
        pplVar1 = &parent_00->ctx;
        do {
          if ((parent_00->field_0).node.schema != (lysc_node *)0x0) {
            LVar7 = LY_EINVAL;
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!node->schema",
                   "lyd_dup_attr_single");
            goto LAB_00125f98;
          }
          attr = (lyd_attr *)calloc(1,0x40);
          if (attr == (lyd_attr *)0x0) {
            pcVar13 = "lyd_dup_attr_single";
            trg_ctx = *pplVar1;
            goto LAB_00125bdd;
          }
          LVar7 = lydict_insert(*pplVar1,*(char **)(lVar15 + 0x10),0,&(attr->name).name);
          if (LVar7 == LY_SUCCESS) {
            plVar14 = (parent_00->field_0).node.schema;
            plVar8 = (lys_module *)pplVar1;
            if (plVar14 != (lysc_node *)0x0) {
              plVar8 = plVar14->module;
            }
            LVar7 = lydict_insert(plVar8->ctx,*(char **)(lVar15 + 0x18),0,&(attr->name).prefix);
            if (LVar7 != LY_SUCCESS) goto LAB_00125cbf;
            plVar14 = (parent_00->field_0).node.schema;
            plVar8 = (lys_module *)pplVar1;
            if (plVar14 != (lysc_node *)0x0) {
              plVar8 = plVar14->module;
            }
            LVar7 = lydict_insert(plVar8->ctx,*(char **)(lVar15 + 0x20),0,
                                  &(attr->name).field_2.module_ns);
            if (LVar7 != LY_SUCCESS) goto LAB_00125cbf;
            plVar14 = (parent_00->field_0).node.schema;
            plVar8 = (lys_module *)pplVar1;
            if (plVar14 != (lysc_node *)0x0) {
              plVar8 = plVar14->module;
            }
            LVar7 = lydict_insert(plVar8->ctx,*(char **)(lVar15 + 0x28),0,&attr->value);
            if (LVar7 != LY_SUCCESS) goto LAB_00125cbf;
            attr->hints = *(uint32_t *)(lVar15 + 0x30);
            LVar4 = *(LY_VALUE_FORMAT *)(lVar15 + 0x34);
            attr->format = LVar4;
            if (*(void **)(lVar15 + 0x38) != (void *)0x0) {
              plVar14 = (parent_00->field_0).node.schema;
              plVar8 = (lys_module *)pplVar1;
              if (plVar14 != (lysc_node *)0x0) {
                plVar8 = plVar14->module;
              }
              LVar7 = ly_dup_prefix_data(plVar8->ctx,LVar4,*(void **)(lVar15 + 0x38),
                                         &attr->val_prefix_data);
              if (LVar7 != LY_SUCCESS) goto LAB_00125cbf;
            }
            attr->parent = parent_00;
            plVar5 = parent_00->attr;
            if (parent_00->attr == (lyd_attr *)0x0) {
              parent_00->attr = attr;
            }
            else {
              do {
                plVar9 = plVar5;
                plVar5 = plVar9->next;
              } while (plVar5 != (lyd_attr *)0x0);
              plVar9->next = attr;
            }
          }
          else {
LAB_00125cbf:
            plVar14 = (parent_00->field_0).node.schema;
            plVar8 = (lys_module *)pplVar1;
            if (plVar14 != (lysc_node *)0x0) {
              plVar8 = plVar14->module;
            }
            lyd_free_attr_single(plVar8->ctx,attr);
          }
          lVar15 = *(long *)(lVar15 + 8);
        } while (lVar15 != 0);
      }
    }
    else {
      for (meta = node->meta; meta != (lyd_meta *)0x0; meta = meta->next) {
        LVar7 = lyd_dup_meta_single_to_ctx(trg_ctx,meta,(lyd_node *)parent_00,(lyd_meta **)0x0);
        if (LVar7 != LY_SUCCESS) goto LAB_00125f98;
      }
    }
  }
  plVar14 = (parent_00->field_0).node.schema;
  if (plVar14 == (lysc_node *)0x0) {
    if ((options & 1) != 0) {
      for (plVar10 = *(lyd_node **)(node + 1); plVar10 != (lyd_node *)0x0; plVar10 = plVar10->next)
      {
        LVar7 = lyd_dup_r(plVar10,trg_ctx,(lyd_node *)parent_00,1,(lyd_node **)0x0,options,
                          (lyd_node **)0x0);
        if (LVar7 != LY_SUCCESS) goto LAB_00125f98;
      }
    }
    LVar7 = lydict_insert(trg_ctx,(char *)node[1].schema,0,&(parent_00->name).name);
    if (((LVar7 != LY_SUCCESS) ||
        (LVar7 = lydict_insert(trg_ctx,(char *)node[1].parent,0,&(parent_00->name).prefix),
        LVar7 != LY_SUCCESS)) ||
       ((LVar7 = lydict_insert(trg_ctx,(char *)node[1].next,0,&(parent_00->name).field_2.module_ns),
        LVar7 != LY_SUCCESS ||
        (LVar7 = lydict_insert(trg_ctx,(char *)node[1].prev,0,&parent_00->value),
        LVar7 != LY_SUCCESS)))) goto LAB_00125f98;
    parent_00->hints = *(uint32_t *)&node[1].meta;
    LVar4 = *(LY_VALUE_FORMAT *)((long)&node[1].meta + 4);
    parent_00->format = LVar4;
    if (node[1].priv == (void *)0x0) goto LAB_0012607e;
    LVar7 = ly_dup_prefix_data(trg_ctx,LVar4,node[1].priv,&parent_00->val_prefix_data);
  }
  else {
    uVar2 = plVar14->nodetype;
    if ((uVar2 & 0xc) == 0) {
      if ((uVar2 & 0x711) != 0) {
        if ((options & 1) == 0) {
          if ((uVar2 == 0x10) && ((plVar14->flags & 0x200) == 0)) {
            plVar10 = *(lyd_node **)(node + 1);
            while ((((plVar10 != (lyd_node *)0x0 &&
                     (plVar14 = plVar10->schema, plVar14 != (lysc_node *)0x0)) &&
                    (plVar14->nodetype == 4)) && ((plVar14->flags & 0x100) != 0))) {
              LVar7 = lyd_dup_r(plVar10,trg_ctx,(lyd_node *)parent_00,1,(lyd_node **)0x0,options,
                                (lyd_node **)0x0);
              if (LVar7 != LY_SUCCESS) goto LAB_00125f98;
              plVar10 = plVar10->next;
            }
          }
        }
        else {
          if (node[1].schema != (lysc_node *)0x0) {
            plVar11 = lyht_new(*(uint32_t *)(node[1].schema)->hash,8,lyd_hash_table_val_equal,
                               (void *)0x0,1);
            (parent_00->name).name = (char *)plVar11;
          }
          for (plVar10 = *(lyd_node **)(node + 1); plVar10 != (lyd_node *)0x0;
              plVar10 = plVar10->next) {
            LVar7 = lyd_dup_r(plVar10,trg_ctx,(lyd_node *)parent_00,1,(lyd_node **)0x0,options,
                              (lyd_node **)0x0);
            if (LVar7 != LY_SUCCESS) goto LAB_00125f98;
          }
        }
        lyd_hash((lyd_node *)parent_00);
        goto LAB_0012607e;
      }
      if ((uVar2 & 0x60) == 0) goto LAB_0012607e;
      (parent_00->field_0).node.hash = node->hash;
      LVar7 = lyd_any_copy_value((lyd_node *)parent_00,(lyd_any_value *)(node + 1),
                                 *(LYD_ANYDATA_VALUETYPE *)&node[1].schema);
    }
    else {
      (parent_00->field_0).node.hash = node->hash;
      if (node->schema == (lysc_node *)0x0) {
        if (trg_ctx == (ly_ctx *)node[2].schema) goto LAB_00125fb2;
        plVar10 = node[1].prev;
      }
      else {
        ctx = node->schema->module->ctx;
        if (trg_ctx == ctx) {
LAB_00125fb2:
          LVar7 = (*(code *)(node[1].schema)->parent->dsc)(trg_ctx,node + 1,&parent_00->child);
          if (LVar7 == LY_SUCCESS) goto LAB_0012607e;
          ly_log(trg_ctx,LY_LLERR,LVar7,"Value duplication failed.");
          goto LAB_00125f98;
        }
        plVar10 = *(lyd_node **)(node + 1);
        if (plVar10 == (lyd_node *)0x0) {
          plVar10 = (lyd_node *)lyd_value_get_canonical(ctx,(lyd_value *)(node + 1));
          plVar14 = (parent_00->field_0).node.schema;
        }
      }
      type = plVar14[1].parent;
      sVar12 = strlen((char *)plVar10);
      LVar7 = lyd_value_store(trg_ctx,(lyd_value *)&parent_00->child,(lysc_type *)type,plVar10,
                              sVar12,'\x01','\x01',(ly_bool *)0x0,LY_VALUE_CANON,(void *)0x0,0x3f3,
                              plVar14,(ly_bool *)0x0);
    }
  }
  if (LVar7 == LY_SUCCESS) {
LAB_0012607e:
    lyd_insert_node(parent,first,(lyd_node *)parent_00,insert_order);
    if (dup_p == (lyd_node **)0x0) {
      return LY_SUCCESS;
    }
    *dup_p = (lyd_node *)parent_00;
    return LY_SUCCESS;
  }
LAB_00125f98:
  lyd_free_tree((lyd_node *)parent_00);
  return LVar7;
}

Assistant:

static LY_ERR
lyd_dup_r(const struct lyd_node *node, const struct ly_ctx *trg_ctx, struct lyd_node *parent, uint32_t insert_order,
        struct lyd_node **first, uint32_t options, struct lyd_node **dup_p)
{
    LY_ERR ret;
    struct lyd_node *dup = NULL;
    struct lyd_meta *meta;
    struct lyd_attr *attr;
    struct lyd_node_any *any;
    const struct lysc_type *type;
    const char *val_can;

    LY_CHECK_ARG_RET(NULL, node, LY_EINVAL);

    if (node->flags & LYD_EXT) {
        if (options & LYD_DUP_NO_EXT) {
            /* no not duplicate this subtree */
            return LY_SUCCESS;
        }

        /* we need to use the same context */
        trg_ctx = LYD_CTX(node);
    }

    if (!node->schema) {
        dup = calloc(1, sizeof(struct lyd_node_opaq));
        ((struct lyd_node_opaq *)dup)->ctx = trg_ctx;
    } else {
        switch (node->schema->nodetype) {
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
        case LYS_CONTAINER:
        case LYS_LIST:
            dup = calloc(1, sizeof(struct lyd_node_inner));
            break;
        case LYS_LEAF:
        case LYS_LEAFLIST:
            dup = calloc(1, sizeof(struct lyd_node_term));
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            dup = calloc(1, sizeof(struct lyd_node_any));
            break;
        default:
            LOGINT(trg_ctx);
            ret = LY_EINT;
            goto error;
        }
    }
    LY_CHECK_ERR_GOTO(!dup, LOGMEM(trg_ctx); ret = LY_EMEM, error);

    if (options & LYD_DUP_WITH_FLAGS) {
        dup->flags = node->flags;
    } else {
        dup->flags = (node->flags & (LYD_DEFAULT | LYD_EXT)) | LYD_NEW;
    }
    if (options & LYD_DUP_WITH_PRIV) {
        dup->priv = node->priv;
    }
    if (trg_ctx == LYD_CTX(node)) {
        dup->schema = node->schema;
    } else {
        ret = lyd_find_schema_ctx(node->schema, trg_ctx, parent, 1, &dup->schema);
        if (ret) {
            /* has no schema but is not an opaque node */
            free(dup);
            dup = NULL;
            goto error;
        }
    }
    dup->prev = dup;

    /* duplicate metadata/attributes */
    if (!(options & LYD_DUP_NO_META)) {
        if (!node->schema) {
            LY_LIST_FOR(((struct lyd_node_opaq *)node)->attr, attr) {
                LY_CHECK_GOTO(ret = lyd_dup_attr_single(attr, dup, NULL), error);
            }
        } else {
            LY_LIST_FOR(node->meta, meta) {
                LY_CHECK_GOTO(ret = lyd_dup_meta_single_to_ctx(trg_ctx, meta, dup, NULL), error);
            }
        }
    }

    /* nodetype-specific work */
    if (!dup->schema) {
        struct lyd_node_opaq *opaq = (struct lyd_node_opaq *)dup;
        struct lyd_node_opaq *orig = (struct lyd_node_opaq *)node;
        struct lyd_node *child;

        if (options & LYD_DUP_RECURSIVE) {
            /* duplicate all the children */
            LY_LIST_FOR(orig->child, child) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        }
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.name, 0, &opaq->name.name), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.prefix, 0, &opaq->name.prefix), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.module_ns, 0, &opaq->name.module_ns), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->value, 0, &opaq->value), error);
        opaq->hints = orig->hints;
        opaq->format = orig->format;
        if (orig->val_prefix_data) {
            ret = ly_dup_prefix_data(trg_ctx, opaq->format, orig->val_prefix_data, &opaq->val_prefix_data);
            LY_CHECK_GOTO(ret, error);
        }
    } else if (dup->schema->nodetype & LYD_NODE_TERM) {
        struct lyd_node_term *term = (struct lyd_node_term *)dup;
        struct lyd_node_term *orig = (struct lyd_node_term *)node;

        term->hash = orig->hash;
        if (trg_ctx == LYD_CTX(node)) {
            ret = orig->value.realtype->plugin->duplicate(trg_ctx, &orig->value, &term->value);
            LY_CHECK_ERR_GOTO(ret, LOGERR(trg_ctx, ret, "Value duplication failed."), error);
        } else {
            /* store canonical value in the target context */
            val_can = lyd_get_value(node);
            type = ((struct lysc_node_leaf *)term->schema)->type;
            ret = lyd_value_store(trg_ctx, &term->value, type, val_can, strlen(val_can), 1, 1, NULL, LY_VALUE_CANON, NULL,
                    LYD_HINT_DATA, term->schema, NULL);
            LY_CHECK_GOTO(ret, error);
        }
    } else if (dup->schema->nodetype & LYD_NODE_INNER) {
        struct lyd_node_inner *orig = (struct lyd_node_inner *)node;
        struct lyd_node *child;

        if (options & LYD_DUP_RECURSIVE) {
            /* create a hash table with the size of the previous hash table (duplicate) */
            if (orig->children_ht) {
                ((struct lyd_node_inner *)dup)->children_ht = lyht_new(orig->children_ht->size, sizeof(struct lyd_node *), lyd_hash_table_val_equal, NULL, 1);
            }

            /* duplicate all the children */
            LY_LIST_FOR(orig->child, child) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        } else if ((dup->schema->nodetype == LYS_LIST) && !(dup->schema->flags & LYS_KEYLESS)) {
            /* always duplicate keys of a list */
            for (child = orig->child; child && lysc_is_key(child->schema); child = child->next) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        }
        lyd_hash(dup);
    } else if (dup->schema->nodetype & LYD_NODE_ANY) {
        dup->hash = node->hash;
        any = (struct lyd_node_any *)node;
        LY_CHECK_GOTO(ret = lyd_any_copy_value(dup, &any->value, any->value_type), error);
    }

    /* insert */
    lyd_insert_node(parent, first, dup, insert_order);

    if (dup_p) {
        *dup_p = dup;
    }
    return LY_SUCCESS;

error:
    lyd_free_tree(dup);
    return ret;
}